

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O1

void __thiscall QSpanCollection::updateRemovedColumns(QSpanCollection *this,int start,int end)

{
  size_t *psVar1;
  Index *this_00;
  int iVar2;
  _List_node_base *p_Var3;
  undefined8 *******pppppppuVar4;
  bool bVar5;
  int iVar6;
  _List_node_base *p_Var7;
  QMapData<std::map<int,_QMap<int,_QSpanCollection::Span_*>,_std::less<int>,_std::allocator<std::pair<const_int,_QMap<int,_QSpanCollection::Span_*>_>_>_>_>
  *pQVar8;
  const_iterator alast;
  const_iterator afirst;
  int iVar9;
  undefined8 *******pppppppuVar10;
  QSpanCollection *pQVar11;
  QSpanCollection *pQVar12;
  int iVar13;
  long in_FS_OFFSET;
  undefined8 *******local_58;
  undefined8 *******pppppppuStack_50;
  long local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar11 = (QSpanCollection *)
            (this->spans).
            super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>.
            _M_impl._M_node.super__List_node_base._M_next;
  if (pQVar11 != this) {
    local_58 = &local_58;
    local_48 = 0;
    iVar13 = (end - start) + 1;
    pppppppuStack_50 = local_58;
    do {
      p_Var3 = (_List_node_base *)
               (pQVar11->spans).
               super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>.
               _M_impl._M_node._M_size;
      iVar2 = *(int *)((long)&p_Var3->_M_prev + 4);
      if (iVar2 < start) {
LAB_0058e867:
        pQVar12 = (QSpanCollection *)
                  (pQVar11->spans).
                  super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>
                  ._M_impl._M_node.super__List_node_base._M_next;
      }
      else {
        iVar6 = *(int *)((long)&p_Var3->_M_next + 4);
        if (iVar6 < start) {
          iVar6 = start + -1;
          if (end < iVar2) {
LAB_0058e800:
            iVar6 = iVar2 - iVar13;
          }
          *(int *)((long)&p_Var3->_M_prev + 4) = iVar6;
        }
        else {
          if (end < iVar2) {
            iVar9 = iVar6 - iVar13;
            if (iVar6 <= end) {
              iVar9 = start;
            }
            *(int *)((long)&p_Var3->_M_next + 4) = iVar9;
            goto LAB_0058e800;
          }
          *(undefined1 *)&p_Var3[1]._M_next = 1;
        }
        if ((*(int *)&p_Var3->_M_next == *(int *)&p_Var3->_M_prev) &&
           (*(int *)((long)&p_Var3->_M_next + 4) == *(int *)((long)&p_Var3->_M_prev + 4))) {
          *(undefined1 *)&p_Var3[1]._M_next = 1;
        }
        if (*(char *)&p_Var3[1]._M_next != '\x01') goto LAB_0058e867;
        p_Var7 = (_List_node_base *)operator_new(0x18);
        p_Var7[1]._M_next = p_Var3;
        std::__detail::_List_node_base::_M_hook(p_Var7);
        local_48 = local_48 + 1;
        pQVar12 = (QSpanCollection *)
                  (pQVar11->spans).
                  super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>
                  ._M_impl._M_node.super__List_node_base._M_next;
        psVar1 = &(this->spans).
                  super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>
                  ._M_impl._M_node._M_size;
        *psVar1 = *psVar1 - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(pQVar11,0x18);
      }
      pQVar11 = pQVar12;
    } while (pQVar12 != this);
    if ((QSpanCollection *)
        (this->spans).
        super__List_base<QSpanCollection::Span_*,_std::allocator<QSpanCollection::Span_*>_>._M_impl.
        _M_node.super__List_node_base._M_next == this) {
      for (pppppppuVar10 = local_58; (undefined8 ********)pppppppuVar10 != &local_58;
          pppppppuVar10 = (undefined8 *******)*pppppppuVar10) {
        if (pppppppuVar10[2] != (undefined8 ******)0x0) {
          operator_delete(pppppppuVar10[2],0x14);
        }
      }
      QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::clear(&this->index);
    }
    else {
      this_00 = &this->index;
      QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::detach(this_00);
      afirst._M_node =
           *(_Base_ptr *)
            ((long)&(((this->index).d.d.ptr)->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10
            );
      pQVar11 = (QSpanCollection *)this_00;
      QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::detach(this_00);
      pQVar8 = (this->index).d.d.ptr;
      while ((_Rb_tree_header *)afirst._M_node != &(pQVar8->m)._M_t._M_impl.super__Rb_tree_header) {
        bVar5 = cleanSpanSubIndex(pQVar11,(SubIndex *)((long)afirst._M_node + 0x28),
                                  -*(int *)((long)afirst._M_node + 0x20),true);
        if (bVar5) {
          alast.i._M_node = (const_iterator)std::_Rb_tree_increment(afirst._M_node);
          afirst._M_node =
               (_Base_ptr)
               QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::erase(this_00,afirst._M_node,alast);
        }
        else {
          afirst._M_node = (_Base_ptr)std::_Rb_tree_increment(afirst._M_node);
        }
        pQVar11 = (QSpanCollection *)this_00;
        QMap<int,_QMap<int,_QSpanCollection::Span_*>_>::detach(this_00);
        pQVar8 = (this_00->d).d.ptr;
      }
      for (pppppppuVar10 = local_58; (undefined8 ********)pppppppuVar10 != &local_58;
          pppppppuVar10 = (undefined8 *******)*pppppppuVar10) {
        if (pppppppuVar10[2] != (undefined8 ******)0x0) {
          operator_delete(pppppppuVar10[2],0x14);
        }
      }
    }
    pppppppuVar10 = local_58;
    while ((undefined8 ********)pppppppuVar10 != &local_58) {
      pppppppuVar4 = (undefined8 *******)*pppppppuVar10;
      operator_delete(pppppppuVar10,0x18);
      pppppppuVar10 = pppppppuVar4;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSpanCollection::updateRemovedColumns(int start, int end)
{
#ifdef DEBUG_SPAN_UPDATE
    qDebug() << start << end << Qt::endl << index;
#endif
    if (spans.empty())
        return;

    SpanList toBeDeleted;
    int delta = end - start + 1;
#ifdef DEBUG_SPAN_UPDATE
    qDebug("Before");
#endif
    for (SpanList::iterator it = spans.begin(); it != spans.end(); ) {
        Span *span = *it;
#ifdef DEBUG_SPAN_UPDATE
        qDebug() << span << *span;
#endif
        if (span->m_right < start) {
            ++it;
            continue;
        }
        if (span->m_left < start) {
            if (span->m_right <= end)
                span->m_right = start - 1;
            else
                span->m_right -= delta;
        } else {
            if (span->m_right > end) {
                if (span->m_left <= end)
                    span->m_left = start;
                else
                    span->m_left -= delta;
                span->m_right -= delta;
            } else {
                span->will_be_deleted = true;
            }
        }
        if (span->m_top == span->m_bottom && span->m_left == span->m_right)
            span->will_be_deleted = true;
        if (span->will_be_deleted) {
            toBeDeleted.push_back(span);
            it = spans.erase(it);
        } else {
            ++it;
        }
    }

#ifdef DEBUG_SPAN_UPDATE
    qDebug("After");
    qDebug() << spans;
#endif
    if (spans.empty()) {
        qDeleteAll(toBeDeleted);
        index.clear();
        return;
    }

    for (Index::iterator it_y = index.begin(); it_y != index.end(); ) {
        int y = -it_y.key();
        if (cleanSpanSubIndex(it_y.value(), y, true))
            it_y = index.erase(it_y);
        else
            ++it_y;
    }

#ifdef DEBUG_SPAN_UPDATE
    qDebug() << index;
    qDebug("Deleted");
    qDebug() << toBeDeleted;
#endif
    qDeleteAll(toBeDeleted);
}